

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spoa_test.cpp
# Opt level: O0

void __thiscall
spoa::test::SpoaAlignmentTest_TypeError_Test::TestBody(SpoaAlignmentTest_TypeError_Test *this)

{
  AssertionResult gtest_ar;
  invalid_argument *exception;
  undefined1 local_18 [8];
  unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> ae;
  SpoaAlignmentTest_TypeError_Test *this_local;
  
  ae._M_t.super___uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>.
  _M_t.super__Tuple_impl<0UL,_spoa::AlignmentEngine_*,_std::default_delete<spoa::AlignmentEngine>_>.
  super__Head_base<0UL,_spoa::AlignmentEngine_*,_false>._M_head_impl =
       (__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
        )(__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
          )this;
  AlignmentEngine::Create((AlignmentEngine *)local_18,4,'\x01',-1,-1);
  std::unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>::~unique_ptr
            ((unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> *)
             local_18);
  return;
}

Assistant:

TEST(SpoaAlignmentTest, TypeError) {
  try {
    auto ae = AlignmentEngine::Create(static_cast<AlignmentType>(4), 1, -1, -1);
  } catch(std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[spoa::AlignmentEngine::Create] error: invalid alignment type!");
  }
}